

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O2

vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> * __thiscall
cfd::CoinSelection::KnapsackSolver
          (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__return_storage_ptr__,CoinSelection *this
          ,int64_t *target_value,vector<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_> *utxos,
          uint64_t min_change,int64_t *select_value,Amount *utxo_fee_value)

{
  pointer ppUVar1;
  long lVar2;
  unkbyte9 Var3;
  pointer ppUVar4;
  CoinSelection *this_00;
  pointer ppUVar5;
  CfdException *this_01;
  long lVar6;
  Utxo **utxo;
  long lVar7;
  long n_total_value;
  value_type *__x;
  value_type *__x_00;
  __normal_iterator<const_cfd::Utxo_**,_std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>_>
  __i;
  long lVar8;
  pointer ppUVar9;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *this_02;
  uint uVar10;
  ulong uVar11;
  uint64_t uVar12;
  Amount AVar13;
  int64_t n_target;
  uint64_t *local_d8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *local_d0;
  vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_> applicable_groups;
  int64_t n_best;
  uint64_t local_a0;
  vector<char,_std::allocator<char>_> vf_best;
  vector<char,_std::allocator<char>_> vf_best2;
  int64_t n_best2;
  int64_t n_effective_total;
  CoinSelection *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n_target = *target_value;
  vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       "cfd_utxo.cpp";
  vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)CONCAT44(vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,0x2f8);
  vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = "KnapsackSolver";
  local_d0 = __return_storage_ptr__;
  local_a0 = min_change;
  local_50 = this;
  core::logger::info<long&>
            ((CfdSourceLocation *)&vf_best,"KnapsackSolver start. target={}",&n_target);
  applicable_groups.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applicable_groups.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applicable_groups.super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  n_effective_total = 0;
  local_d8 = (uint64_t *)select_value;
  core::RandomNumberUtil::GetRandomIndexes
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&indexes,
             (uint32_t)
             ((ulong)((long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3));
  lVar7 = 0;
  lVar8 = 0;
  uVar11 = 0;
  n_total_value = 0;
  __x_00 = (value_type *)0x0;
  do {
    ppUVar4 = applicable_groups.
              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppUVar5 = applicable_groups.
              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    this_02 = local_d0;
    if ((ulong)((long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar11) {
      if (lVar8 == n_target) {
        uVar12 = 0;
        lVar7 = 0;
        for (; ppUVar5 != ppUVar4; ppUVar5 = ppUVar5 + 1) {
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(this_02,*ppUVar5);
          uVar12 = uVar12 + (*ppUVar5)->amount;
          lVar7 = lVar7 + (*ppUVar5)->fee;
        }
        *local_d8 = uVar12;
        AVar13 = core::Amount::CreateBySatoshiAmount(lVar7);
        utxo_fee_value->amount_ = AVar13.amount_;
        utxo_fee_value->ignore_check_ = AVar13.ignore_check_;
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = "cfd_utxo.cpp";
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(vf_best.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,0x32a);
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = "KnapsackSolver";
        vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(((long)(this_02->
                                    super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->
                                   super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                                   _M_impl.super__Vector_impl_data._M_start) / 0xd8);
        core::logger::info<unsigned_long>
                  ((CfdSourceLocation *)&vf_best,"KnapsackSolver end. results={}",
                   (unsigned_long *)&vf_best2);
      }
      else if (n_total_value < n_target) {
        if (__x_00 == (value_type *)0x0) {
          vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = "cfd_utxo.cpp";
          vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(vf_best.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,0x332);
          vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = "KnapsackSolver";
          core::logger::warn<long&,long&>
                    ((CfdSourceLocation *)&vf_best,
                     "insufficient funds. effective_total:{} target:{}",&n_effective_total,&n_target
                    );
          this_01 = (CfdException *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&vf_best,"insufficient funds.",(allocator *)&vf_best2);
          core::CfdException::CfdException(this_01,kCfdIllegalStateError,(string *)&vf_best);
          __cxa_throw(this_01,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
        std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(local_d0,__x_00);
        *local_d8 = __x_00->amount;
        AVar13 = core::Amount::CreateBySatoshiAmount(__x_00->fee);
        utxo_fee_value->amount_ = AVar13.amount_;
        utxo_fee_value->ignore_check_ = AVar13.ignore_check_;
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = "cfd_utxo.cpp";
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(vf_best.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,0x33b);
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = "KnapsackSolver";
        vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)(((long)(this_02->
                                    super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->
                                   super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                                   _M_impl.super__Vector_impl_data._M_start) / 0xd8);
        core::logger::info<unsigned_long>
                  ((CfdSourceLocation *)&vf_best,"KnapsackSolver end. results={}",
                   (unsigned_long *)&vf_best2);
      }
      else {
        if (applicable_groups.
            super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            applicable_groups.
            super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          lVar8 = (long)applicable_groups.
                        super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)applicable_groups.
                        super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          uVar11 = lVar8 >> 3;
          lVar7 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                    (applicable_groups.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     applicable_groups.
                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar8 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                      (ppUVar5,ppUVar4);
          }
          else {
            ppUVar9 = ppUVar5 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                      (ppUVar5,ppUVar9);
            for (; ppUVar9 != ppUVar4; ppUVar9 = ppUVar9 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cfd::Utxo_const**,std::vector<cfd::Utxo_const*,std::allocator<cfd::Utxo_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<cfd::CoinSelection::KnapsackSolver(long_const&,std::vector<cfd::Utxo*,std::allocator<cfd::Utxo*>>const&,unsigned_long,long*,cfd::core::Amount*)::__0>>
                        (ppUVar9);
            }
          }
        }
        this_00 = local_50;
        this_02 = local_d0;
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        (local_50->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
             (local_50->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        (local_50->randomize_cache_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        ApproximateBestSubset
                  (local_50,&applicable_groups,n_total_value,n_target,&vf_best,&n_best,100000);
        if ((n_best != n_target) && ((long)(n_target + local_a0) <= n_total_value)) {
          n_best2 = n_best;
          vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          ApproximateBestSubset
                    (this_00,&applicable_groups,n_total_value,n_target + local_a0,&vf_best2,&n_best2
                     ,100000);
          if ((n_best2 == n_target) || (n_best2 < n_best)) {
            n_best = n_best2;
            std::vector<char,_std::allocator<char>_>::operator=(&vf_best,&vf_best2);
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&vf_best2.super__Vector_base<char,_std::allocator<char>_>);
        }
        if ((__x_00 == (value_type *)0x0) ||
           ((n_best == n_target || (long)(local_a0 + n_target) <= n_best &&
            (n_best < __x_00->effective_k_value)))) {
          lVar7 = 0;
          uVar12 = 0;
          ppUVar5 = applicable_groups.
                    super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          for (uVar10 = 0; uVar11 = (ulong)uVar10,
              uVar11 < (ulong)((long)applicable_groups.
                                     super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppUVar5 >> 3
                              ); uVar10 = uVar10 + 1) {
            if (vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11] != '\0') {
              std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(this_02,ppUVar5[uVar11])
              ;
              uVar12 = uVar12 + applicable_groups.
                                super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar11]->amount;
              lVar7 = lVar7 + applicable_groups.
                              super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11]->fee;
              ppUVar5 = applicable_groups.
                        super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            }
          }
          *local_d8 = uVar12;
          AVar13 = core::Amount::CreateBySatoshiAmount(lVar7);
          Var3 = AVar13._0_9_;
        }
        else {
          std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(this_02,__x_00);
          *local_d8 = __x_00->amount;
          AVar13 = core::Amount::CreateBySatoshiAmount(__x_00->fee);
          Var3 = AVar13._0_9_;
        }
        utxo_fee_value->amount_ = (int64_t)Var3;
        utxo_fee_value->ignore_check_ = SUB91((unkuint9)Var3 >> 0x40,0);
        vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = "cfd_utxo.cpp";
        vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(vf_best2.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,0x36d);
        vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = "KnapsackSolver";
        n_best2 = ((long)(this_02->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_02->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl
                        .super__Vector_impl_data._M_start) / 0xd8;
        core::logger::info<unsigned_long>
                  ((CfdSourceLocation *)&vf_best2,"KnapsackSolver end. results={}",
                   (unsigned_long *)&n_best2);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&vf_best.super__Vector_base<char,_std::allocator<char>_>);
      }
LAB_0034a337:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::~_Vector_base
                (&applicable_groups.
                  super__Vector_base<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>);
      return this_02;
    }
    ppUVar1 = (utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    __x = *(value_type **)((long)ppUVar1 + lVar7);
    if (__x->effective_k_value == n_target) {
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::push_back(local_d0,__x);
      lVar7 = *(long *)((long)(utxos->super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>)
                              ._M_impl.super__Vector_impl_data._M_start + lVar7);
      *local_d8 = *(uint64_t *)(lVar7 + 0x80);
      AVar13 = core::Amount::CreateBySatoshiAmount(*(int64_t *)(lVar7 + 0xc0));
      utxo_fee_value->amount_ = AVar13.amount_;
      utxo_fee_value->ignore_check_ = AVar13.ignore_check_;
      vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = "cfd_utxo.cpp";
      vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_finish._4_4_,0x30c);
      vf_best.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = "KnapsackSolver";
      vf_best2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(((long)(this_02->
                                  super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>)._M_impl
                                  .super__Vector_impl_data._M_finish -
                           (long)(this_02->super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>
                                 )._M_impl.super__Vector_impl_data._M_start) / 0xd8);
      core::logger::info<unsigned_long>
                ((CfdSourceLocation *)&vf_best,"KnapsackSolver end. results={}",
                 (unsigned_long *)&vf_best2);
      goto LAB_0034a337;
    }
    if (__x->effective_k_value < (long)(n_target + local_a0)) {
      std::vector<const_cfd::Utxo_*,_std::allocator<const_cfd::Utxo_*>_>::push_back
                (&applicable_groups,(value_type *)((long)ppUVar1 + lVar7));
      lVar2 = *(long *)(*(long *)((long)(utxos->
                                        super__Vector_base<cfd::Utxo_*,_std::allocator<cfd::Utxo_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar7) + 0xd0);
      lVar6 = 0;
      if (0 < lVar2) {
        lVar6 = lVar2;
      }
      n_total_value = n_total_value + lVar6;
      lVar8 = lVar8 + lVar2;
      n_effective_total = lVar8;
LAB_00349ef1:
      __x = __x_00;
    }
    else if ((__x_00 != (value_type *)0x0) && (__x_00->amount <= __x->amount)) goto LAB_00349ef1;
    uVar11 = uVar11 + 1;
    lVar7 = lVar7 + 8;
    __x_00 = __x;
  } while( true );
}

Assistant:

std::vector<Utxo> CoinSelection::KnapsackSolver(
    const int64_t& target_value, const std::vector<Utxo*>& utxos,
    uint64_t min_change, int64_t* select_value, Amount* utxo_fee_value) {
  std::vector<Utxo> ret_utxos;
  int64_t n_target = target_value;
  int64_t n_min_change = static_cast<int64_t>(min_change);
  info(CFD_LOG_SOURCE, "KnapsackSolver start. target={}", n_target);

  // List of values less than target
  const Utxo* lowest_larger = nullptr;
  std::vector<const Utxo*> applicable_groups;
  // int64_t n_total = 0;
  int64_t n_effective_total = 0;  // amount excluding fee
  int64_t n_effective_total_max = 0;
  int64_t utxo_fee = 0;

  std::vector<uint32_t> indexes =
      RandomNumberUtil::GetRandomIndexes(static_cast<uint32_t>(utxos.size()));

  for (size_t index = 0; index < indexes.size(); ++index) {
    // if (utxos[index]->amount == n_target) {
    if (utxos[index]->effective_k_value == n_target) {
      // that meets the required value
      ret_utxos.push_back(*utxos[index]);
      *select_value = utxos[index]->amount;
      *utxo_fee_value = Amount::CreateBySatoshiAmount(utxos[index]->fee);
      info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
      return ret_utxos;

    } else if (utxos[index]->effective_k_value < n_target + n_min_change) {
      // } else if ((utxos[index]->amount < n_target + min_change) {
      applicable_groups.push_back(utxos[index]);
      // n_total += utxos[index]->amount;
      if (utxos[index]->effective_k_value > 0) {
        n_effective_total_max += utxos[index]->effective_k_value;
      }
      n_effective_total += utxos[index]->effective_k_value;

    } else if (
        lowest_larger == nullptr ||
        utxos[index]->amount < lowest_larger->amount) {
      // greater than `n_target + min_change`
      lowest_larger = utxos[index];
    }
  }

  // if (n_total == n_target) {
  if (n_effective_total == n_target) {
    uint64_t ret_value = 0;
    for (const auto& utxo : applicable_groups) {
      ret_utxos.push_back(*utxo);
      ret_value += utxo->amount;
      utxo_fee += utxo->fee;
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  // if (n_total < n_target) {
  if (n_effective_total_max < n_target) {
    if (lowest_larger == nullptr) {
      warn(
          CFD_LOG_SOURCE, "insufficient funds. effective_total:{} target:{}",
          n_effective_total, n_target);
      throw CfdException(
          CfdError::kCfdIllegalStateError, "insufficient funds.");
    }

    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);
    info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
    return ret_utxos;
  }

  std::sort(
      applicable_groups.begin(), applicable_groups.end(),
      [](const Utxo* a, const Utxo* b) {
        return a->effective_k_value > b->effective_k_value;
      });
  std::vector<char> vf_best;
  int64_t n_best;

  randomize_cache_.clear();
  ApproximateBestSubset(
      applicable_groups, n_effective_total_max, n_target, &vf_best, &n_best,
      kApproximateBestSubsetIterations);
  if (n_best != n_target && n_effective_total_max >= n_target + n_min_change) {
    int64_t n_best2 = n_best;
    std::vector<char> vf_best2;
    ApproximateBestSubset(
        applicable_groups, n_effective_total_max, (n_target + n_min_change),
        &vf_best2, &n_best2, kApproximateBestSubsetIterations);
    if ((n_best2 == n_target) || (n_best > n_best2)) {
      n_best = n_best2;
      vf_best = vf_best2;
    }
  }

  // NOLINT If we have a bigger coin and (either the stochastic approximation didn't find a good solution,
  // NOLINT                                or the next bigger coin is closer), return the bigger coin
  if (lowest_larger != nullptr &&
      ((n_best != n_target && n_best < n_target + n_min_change) ||
       lowest_larger->effective_k_value <= n_best)) {
    // lowest_larger->amount <= n_best)) {
    ret_utxos.push_back(*lowest_larger);
    *select_value = static_cast<int64_t>(lowest_larger->amount);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(lowest_larger->fee);

  } else {
    uint64_t ret_value = 0;
    for (unsigned int i = 0; i < applicable_groups.size(); i++) {
      if (vf_best[i]) {
        ret_utxos.push_back(*applicable_groups[i]);
        ret_value += applicable_groups[i]->amount;
        utxo_fee += applicable_groups[i]->fee;
      }
    }
    *select_value = static_cast<int64_t>(ret_value);
    *utxo_fee_value = Amount::CreateBySatoshiAmount(utxo_fee);
  }
  info(CFD_LOG_SOURCE, "KnapsackSolver end. results={}", ret_utxos.size());
  return ret_utxos;
}